

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O3

void setarrayvector(lua_State *L,Table *t,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  TValue *pTVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  if (size < -1) {
    pTVar4 = (TValue *)luaM_toobig(L);
  }
  else {
    pTVar4 = (TValue *)luaM_realloc_(L,t->array,(long)t->sizearray << 4,(long)size << 4);
  }
  t->array = pTVar4;
  auVar3 = _DAT_0011d290;
  auVar2 = _DAT_0011d280;
  auVar1 = _DAT_0011d270;
  iVar10 = t->sizearray;
  if (iVar10 < size) {
    lVar7 = (long)size - (long)iVar10;
    lVar8 = lVar7 + -1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    piVar5 = &pTVar4[(long)iVar10 + 3].tt;
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_0011d290;
    do {
      auVar11._8_4_ = (int)uVar6;
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = (int)(uVar6 >> 0x20);
      auVar12 = (auVar11 | auVar2) ^ auVar3;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        piVar5[-0xc] = 0;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        piVar5[-8] = 0;
      }
      auVar11 = (auVar11 | auVar1) ^ auVar3;
      iVar13 = auVar11._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
        piVar5[-4] = 0;
        *piVar5 = 0;
      }
      uVar6 = uVar6 + 4;
      piVar5 = piVar5 + 0x10;
    } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar6);
  }
  t->sizearray = size;
  return;
}

Assistant:

static void setarrayvector (lua_State *L, Table *t, int size) {
  int i;
  luaM_reallocvector(L, t->array, t->sizearray, size, TValue);
  for (i=t->sizearray; i<size; i++)
     setnilvalue(&t->array[i]);
  t->sizearray = size;
}